

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqReqRep.cpp
# Opt level: O1

shared_ptr<std::vector<char,_std::allocator<char>_>_> __thiscall
adios2::zmq::ZmqReqRep::ReceiveRequest(ZmqReqRep *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  long in_RSI;
  shared_ptr<std::vector<char,_std::allocator<char>_>_> sVar2;
  int bytes;
  undefined1 local_1d;
  int local_1c;
  
  local_1c = zmq_recv(*(undefined8 *)(in_RSI + 0x28),*(long *)(in_RSI + 8),
                      *(long *)(in_RSI + 0x18) - *(long *)(in_RSI + 8),0);
  if (local_1c < 1) {
    *(undefined8 *)this = 0;
    (this->m_ReceiverBuffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    _Var1._M_pi = extraout_RDX;
  }
  else {
    *(undefined8 *)this = 0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<std::vector<char,std::allocator<char>>,std::allocator<std::vector<char,std::allocator<char>>>,int&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->m_ReceiverBuffer,
               (vector<char,_std::allocator<char>_> **)this,
               (allocator<std::vector<char,_std::allocator<char>_>_> *)&local_1d,&local_1c);
    memcpy((void *)**(undefined8 **)this,*(void **)(in_RSI + 8),(long)local_1c);
    _Var1._M_pi = extraout_RDX_00;
  }
  sVar2.super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  sVar2.super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (shared_ptr<std::vector<char,_std::allocator<char>_>_>)
         sVar2.
         super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<std::vector<char>> ZmqReqRep::ReceiveRequest()
{
    int bytes = zmq_recv(m_Socket, m_ReceiverBuffer.data(), m_ReceiverBuffer.capacity(), 0);
    if (bytes <= 0)
    {
        return nullptr;
    }
    auto request = std::make_shared<std::vector<char>>(bytes);
    std::memcpy(request->data(), m_ReceiverBuffer.data(), bytes);
    return request;
}